

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DepsBuildEngineTest.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_67cc9::SimpleRule::SimpleRule
          (SimpleRule *this,KeyType *key,
          vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_> *inputs,
          ComputeFnType *compute,ValidFnType *valid)

{
  CommandSignature local_38;
  ValidFnType *local_30;
  ValidFnType *valid_local;
  ComputeFnType *compute_local;
  vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_> *inputs_local;
  KeyType *key_local;
  SimpleRule *this_local;
  
  local_30 = valid;
  valid_local = (ValidFnType *)compute;
  compute_local = (ComputeFnType *)inputs;
  inputs_local = (vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_> *)key;
  key_local = (KeyType *)this;
  memset(&local_38,0,8);
  llbuild::basic::CommandSignature::CommandSignature(&local_38);
  llbuild::core::Rule::Rule(&this->super_Rule,key,&local_38);
  (this->super_Rule)._vptr_Rule = (_func_int **)&PTR__SimpleRule_0038e520;
  std::function<int_(const_std::vector<int,_std::allocator<int>_>_&)>::function
            (&this->compute,compute);
  std::vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>::vector
            (&this->inputs,
             (vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_> *)
             compute_local);
  std::function<bool_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>::function
            (&this->valid,valid);
  return;
}

Assistant:

SimpleRule(const KeyType& key, const std::vector<KeyType>& inputs,
               SimpleTask::ComputeFnType compute, ValidFnType valid = nullptr)
        : Rule(key), compute(compute), inputs(inputs), valid(valid) { }